

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrgload.c
# Opt level: O2

FT_Error pfr_glyph_load_rec(PFR_Glyph glyph,FT_Stream stream,FT_ULong gps_offset,FT_ULong offset,
                           FT_ULong size)

{
  short *psVar1;
  long *plVar2;
  long *plVar3;
  char *pcVar4;
  byte bVar5;
  byte *pbVar6;
  FT_Memory memory;
  char *pcVar7;
  short sVar8;
  FT_Error FVar9;
  FT_Pos *pFVar10;
  PFR_SubGlyphRec *pPVar12;
  PFR_Glyph pPVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  FT_Vector *pFVar22;
  long lVar23;
  FT_GlyphLoader pFVar24;
  FT_GlyphLoader pFVar25;
  FT_ULong FVar26;
  FT_GlyphLoader pFVar27;
  FT_GlyphLoader pFVar28;
  byte bVar29;
  ulong uVar30;
  uint uVar31;
  FT_GlyphLoader limit;
  undefined1 auVar32 [16];
  FT_Error error;
  FT_GlyphLoader local_a8;
  ulong local_a0;
  FT_GlyphLoader local_98;
  FT_Stream local_90;
  FT_ULong local_88;
  PFR_Glyph local_80;
  FT_Vector local_78;
  FT_Pos local_68;
  FT_Pos FStack_60;
  FT_Pos local_58;
  FT_Pos FStack_50;
  FT_GlyphLoader local_48;
  ulong uStack_40;
  long lVar11;
  
  FVar9 = FT_Stream_Seek(stream,offset + gps_offset);
  if (FVar9 != 0) {
    return FVar9;
  }
  FVar9 = FT_Stream_EnterFrame(stream,size);
  if (FVar9 != 0) {
    return FVar9;
  }
  pbVar6 = stream->cursor;
  limit = (FT_GlyphLoader)(pbVar6 + size);
  if ((size == 0) || (-1 < (char)*pbVar6)) {
    error = 0;
    FVar9 = 8;
    if (0 < (long)size) {
      local_a8 = (FT_GlyphLoader)(pbVar6 + 1);
      bVar5 = *pbVar6;
      if (-1 < (char)bVar5) {
        if ((bVar5 & 4) == 0) {
          FVar26 = 0;
          uVar30 = 0;
          if ((bVar5 & 2) != 0) {
            if (size == 1) goto LAB_00148c81;
            local_a8 = (FT_GlyphLoader)(pbVar6 + 2);
            uVar30 = (ulong)pbVar6[1];
          }
          if ((bVar5 & 1) != 0) {
            pFVar24 = (FT_GlyphLoader)((long)&local_a8->memory + 1);
            if (limit < pFVar24) goto LAB_00148c81;
            FVar26 = (FT_ULong)*(byte *)&local_a8->memory;
            local_a8 = pFVar24;
          }
        }
        else {
          if (size == 1) goto LAB_00148c81;
          local_a8 = (FT_GlyphLoader)(pbVar6 + 2);
          uVar30 = (ulong)(pbVar6[1] & 0xf);
          FVar26 = (FT_ULong)(pbVar6[1] >> 4);
        }
        pFVar24 = local_a8;
        uVar17 = (int)uVar30 + (int)FVar26;
        if (glyph->max_xy_control < uVar17) {
          local_90 = (FT_Stream)(ulong)(uVar17 + 7 & 0xfffffff8);
          local_a0 = uVar30;
          local_98 = limit;
          local_88 = FVar26;
          pFVar10 = (FT_Pos *)
                    ft_mem_realloc(glyph->loader->memory,8,(ulong)glyph->max_xy_control,
                                   (FT_Long)local_90,glyph->x_control,&error);
          glyph->x_control = pFVar10;
          FVar9 = error;
          if (error != 0) goto LAB_00148c81;
          glyph->max_xy_control = (FT_UInt)local_90;
          FVar26 = local_88;
          uVar30 = local_a0;
          limit = local_98;
        }
        else {
          pFVar10 = glyph->x_control;
        }
        FVar9 = 8;
        glyph->y_control = pFVar10 + (uVar30 & 0xffffffff);
        uVar18 = 0;
        uVar19 = 0;
        for (uVar15 = 0; uVar17 != uVar15; uVar15 = uVar15 + 1) {
          if ((uVar15 & 7) == 0) {
            pFVar25 = (FT_GlyphLoader)((long)&pFVar24->memory + 1);
            if (limit < pFVar25) goto LAB_00148c81;
            uVar18 = (ulong)*(byte *)&pFVar24->memory;
            pFVar24 = pFVar25;
          }
          if ((uVar18 & 1) == 0) {
            pFVar25 = (FT_GlyphLoader)((long)&pFVar24->memory + 1);
            if (limit < pFVar25) goto LAB_00148c81;
            uVar19 = uVar19 + *(byte *)&pFVar24->memory;
          }
          else {
            pFVar25 = (FT_GlyphLoader)((long)&pFVar24->memory + 2);
            if (limit < pFVar25) goto LAB_00148c81;
            uVar19 = (int)(short)((ushort)*(byte *)&pFVar24->memory << 8) |
                     (uint)*(byte *)((long)&pFVar24->memory + 1);
          }
          pFVar10[uVar15] = (long)(int)uVar19;
          uVar18 = uVar18 >> 1;
          pFVar24 = pFVar25;
        }
        local_a8 = pFVar24;
        local_a0 = uVar30;
        local_88 = FVar26;
        if (((bVar5 & 8) == 0) ||
           (error = pfr_extra_items_skip((FT_Byte **)&local_a8,(FT_Byte *)limit), FVar9 = error,
           error == 0)) {
          glyph->path_begun = '\0';
          local_78.x = 0;
          local_78.y = 0;
          local_48 = (FT_GlyphLoader)0x0;
          uStack_40 = 0;
          pFVar24 = local_a8;
LAB_00148e4c:
          pFVar25 = (FT_GlyphLoader)((long)&pFVar24->memory + 1);
          if (limit < pFVar25) goto LAB_001491fb;
          uVar20 = *(byte *)&pFVar24->memory & 0xf;
          bVar5 = *(byte *)&pFVar24->memory >> 4;
          uVar31 = (uint)bVar5;
          uVar19 = (uint)bVar5;
          uVar17 = uVar31;
          local_a8 = pFVar25;
          switch(uVar31) {
          case 0:
            goto switchD_00148e8d_caseD_0;
          case 1:
          case 4:
          case 5:
            uVar17 = 1;
            uVar19 = uVar20;
            break;
          case 2:
            if (uVar20 < (uint)local_a0) {
              local_78.x = (FT_Pos)glyph->x_control[uVar20];
LAB_00148edc:
              local_78.y = uStack_40;
              local_48 = (FT_GlyphLoader)local_78.x;
              uVar19 = 0;
              uVar17 = 0;
              uVar31 = 0;
              goto switchD_00148e8d_caseD_0;
            }
            goto LAB_001491fb;
          case 3:
            if (uVar20 < (uint)local_88) {
              local_78.x = (FT_Pos)local_48;
              uStack_40 = glyph->y_control[uVar20];
              goto LAB_00148edc;
            }
LAB_001491fb:
            FVar9 = 8;
            goto LAB_00148c81;
          case 6:
            uVar19 = 0xb8e;
            goto LAB_00148f06;
          case 7:
            uVar19 = 0xe2b;
LAB_00148f06:
            uVar17 = 3;
            break;
          default:
            uVar17 = 4;
            uVar19 = uVar20;
          }
          uVar31 = 0;
switchD_00148e8d_caseD_0:
          pFVar22 = &local_78;
          pFVar24 = pFVar25;
LAB_00148f16:
          if (uVar17 <= uVar31) goto LAB_0014909d;
          switch(uVar19 & 3) {
          case 0:
            pFVar25 = (FT_GlyphLoader)((long)&pFVar24->memory + 1);
            if (limit < pFVar25) goto LAB_001491fb;
            if ((byte)local_a0 <= *(byte *)&pFVar24->memory) goto LAB_001491fb;
            pFVar22->x = glyph->x_control[*(byte *)&pFVar24->memory];
            switch(uVar19 >> 2 & 3) {
            case 0:
              goto switchD_00148fb7_caseD_0;
            case 1:
switchD_00148fb7_caseD_1:
              pFVar24 = (FT_GlyphLoader)((long)&pFVar25->memory + 2);
              if (pFVar24 <= limit) {
                uVar30 = (long)(short)((ushort)*(byte *)&pFVar25->memory << 8) |
                         (ulong)*(byte *)((long)&pFVar25->memory + 1);
                break;
              }
              goto LAB_001491fb;
            case 2:
switchD_00148fb7_caseD_2:
              pFVar24 = (FT_GlyphLoader)((long)&pFVar25->memory + 1);
              if (limit < pFVar24) goto LAB_001491fb;
              uVar30 = (long)(char)*(byte *)&pFVar25->memory + uStack_40;
              break;
            case 3:
switchD_00148fb7_caseD_3:
              pFVar24 = pFVar25;
              uVar30 = uStack_40;
            }
            goto LAB_0014905a;
          case 1:
            pFVar25 = (FT_GlyphLoader)((long)&pFVar24->memory + 2);
            if (limit < pFVar25) goto LAB_001491fb;
            pFVar22->x = (long)(short)((ushort)*(byte *)&pFVar24->memory << 8) |
                         (ulong)*(byte *)((long)&pFVar24->memory + 1);
            switch(uVar19 >> 2 & 3) {
            case 1:
              goto switchD_00148fb7_caseD_1;
            case 2:
              goto switchD_00148fb7_caseD_2;
            case 3:
              goto switchD_00148fb7_caseD_3;
            }
            break;
          case 2:
            pFVar25 = (FT_GlyphLoader)((long)&pFVar24->memory + 1);
            if (limit < pFVar25) goto LAB_001491fb;
            pFVar22->x = (FT_Pos)((long)&local_48->memory + (long)(char)*(byte *)&pFVar24->memory);
            switch(uVar19 >> 2 & 3) {
            case 1:
              goto switchD_00148fb7_caseD_1;
            case 2:
              goto switchD_00148fb7_caseD_2;
            case 3:
              goto switchD_00148fb7_caseD_3;
            }
            break;
          case 3:
            pFVar22->x = (FT_Pos)local_48;
            pFVar25 = pFVar24;
            switch(uVar19 >> 2 & 3) {
            case 1:
              goto switchD_00148fb7_caseD_1;
            case 2:
              goto switchD_00148fb7_caseD_2;
            case 3:
              goto switchD_00148fb7_caseD_3;
            }
          }
switchD_00148fb7_caseD_0:
          pFVar24 = (FT_GlyphLoader)((long)&pFVar25->memory + 1);
          if ((limit < pFVar24) || ((byte)local_88 <= *(byte *)&pFVar25->memory)) goto LAB_001491fb;
          uVar30 = glyph->y_control[*(byte *)&pFVar25->memory];
LAB_0014905a:
          pFVar22->y = uVar30;
          if (uVar17 == 4 && uVar31 == 0) {
            pFVar25 = (FT_GlyphLoader)((long)&pFVar24->memory + 1);
            if (limit < pFVar25) goto LAB_001491fb;
            uVar19 = (uint)*(byte *)&pFVar24->memory;
            uVar17 = 3;
            pFVar24 = pFVar25;
          }
          else {
            uVar19 = uVar19 >> 4;
          }
          local_48 = (FT_GlyphLoader)pFVar22->x;
          uStack_40 = pFVar22->y;
          pFVar22 = pFVar22 + 1;
          uVar31 = uVar31 + 1;
          goto LAB_00148f16;
        }
      }
    }
LAB_00148c81:
    FT_Stream_ExitFrame(stream);
    return FVar9;
  }
  pFVar24 = glyph->loader;
  pPVar13 = (PFR_Glyph)(ulong)glyph->num_subs;
  local_a8 = (FT_GlyphLoader)((ulong)local_a8 & 0xffffffff00000000);
  local_a0 = (ulong)pPVar13;
  local_88 = gps_offset;
  if (0 < (long)size) {
    memory = pFVar24->memory;
    local_78.x = (FT_Pos)(pbVar6 + 1);
    bVar5 = *pbVar6;
    uVar17 = (uint)bVar5;
    if ((char)bVar5 < '\0') {
      if ((bVar5 & 0x40) != 0) {
        local_90 = (FT_Stream)(ulong)bVar5;
        iVar16 = pfr_extra_items_skip((FT_Byte **)&local_78,(FT_Byte *)limit);
        local_a8 = (FT_GlyphLoader)CONCAT44(local_a8._4_4_,iVar16);
        if (iVar16 != 0) goto LAB_00148ac5;
        pPVar13 = (PFR_Glyph)(ulong)glyph->num_subs;
        uVar17 = (uint)local_90;
      }
      uVar17 = uVar17 & 0x3f;
      uVar19 = (int)pPVar13 + uVar17;
      if (glyph->max_subs < uVar19) {
        uVar19 = uVar19 + 3 & 0xfffffffc;
        if (0x40 < uVar19) {
LAB_00148cf1:
          iVar16 = 8;
          goto LAB_00148ac5;
        }
        local_98 = limit;
        local_90 = (FT_Stream)(ulong)uVar17;
        local_80 = pPVar13;
        pPVar12 = (PFR_SubGlyphRec *)
                  ft_mem_realloc(memory,0x20,(ulong)glyph->max_subs,(ulong)uVar19,glyph->subs,
                                 (FT_Error *)&local_a8);
        glyph->subs = pPVar12;
        iVar16 = (int)local_a8;
        if ((int)local_a8 != 0) goto LAB_00148ac5;
        glyph->max_subs = uVar19;
        uVar17 = (uint)local_90;
        pPVar13 = local_80;
        limit = local_98;
      }
      else {
        pPVar12 = glyph->subs;
      }
      uVar30 = (ulong)pPVar13 & 0xffffffff;
      iVar16 = 0;
      pFVar25 = (FT_GlyphLoader)local_78.x;
      for (lVar11 = 0; uVar17 << 5 != (int)lVar11; lVar11 = lVar11 + 0x20) {
        pFVar27 = (FT_GlyphLoader)((long)&pFVar25->memory + 1);
        if (limit < pFVar27) goto LAB_00148cf1;
        bVar5 = *(byte *)&pFVar25->memory;
        *(undefined8 *)((long)&pPVar12[uVar30].x_scale + lVar11) = 0x10000;
        if ((bVar5 & 0x10) != 0) {
          pFVar27 = (FT_GlyphLoader)((long)&pFVar25->memory + 3);
          if (limit < pFVar27) goto LAB_00148cf1;
          *(ulong *)((long)&pPVar12[uVar30].x_scale + lVar11) =
               ((long)(short)((ushort)*(byte *)((long)&pFVar25->memory + 1) << 8) |
               (ulong)*(byte *)((long)&pFVar25->memory + 2)) << 4;
        }
        *(undefined8 *)((long)&pPVar12[uVar30].y_scale + lVar11) = 0x10000;
        if ((bVar5 & 0x20) != 0) {
          pFVar25 = (FT_GlyphLoader)((long)&pFVar27->memory + 2);
          if (limit < pFVar25) goto LAB_00148cf1;
          *(ulong *)((long)&pPVar12[uVar30].y_scale + lVar11) =
               ((long)(short)((ushort)*(byte *)&pFVar27->memory << 8) |
               (ulong)*(byte *)((long)&pFVar27->memory + 1)) << 4;
          pFVar27 = pFVar25;
        }
        if ((bVar5 & 3) == 2) {
          pFVar25 = (FT_GlyphLoader)((long)&pFVar27->memory + 1);
          if (limit < pFVar25) goto LAB_00148cf1;
          uVar19 = (uint)(char)*(byte *)&pFVar27->memory;
          pFVar27 = pFVar25;
        }
        else {
          uVar19 = 0;
          if ((bVar5 & 3) == 1) {
            pFVar25 = (FT_GlyphLoader)((long)&pFVar27->memory + 2);
            if (limit < pFVar25) goto LAB_00148cf1;
            uVar19 = (int)(short)((ushort)*(byte *)&pFVar27->memory << 8) |
                     (uint)*(byte *)((long)&pFVar27->memory + 1);
            pFVar27 = pFVar25;
          }
        }
        bVar29 = bVar5 >> 2 & 3;
        if (bVar29 == 2) {
          pFVar25 = (FT_GlyphLoader)((long)&pFVar27->memory + 1);
          if (limit < pFVar25) goto LAB_00148cf1;
          uVar31 = (uint)(char)*(byte *)&pFVar27->memory;
          pFVar27 = pFVar25;
        }
        else {
          uVar31 = 0;
          if (bVar29 == 1) {
            pFVar25 = (FT_GlyphLoader)((long)&pFVar27->memory + 2);
            if (limit < pFVar25) goto LAB_00148cf1;
            uVar31 = (int)(short)((ushort)*(byte *)&pFVar27->memory << 8) |
                     (uint)*(byte *)((long)&pFVar27->memory + 1);
            pFVar27 = pFVar25;
          }
        }
        *(uint *)((long)&pPVar12[uVar30].x_delta + lVar11) = uVar19;
        *(uint *)((long)&pPVar12[uVar30].y_delta + lVar11) = uVar31;
        if ((bVar5 & 0x40) == 0) {
          pFVar28 = (FT_GlyphLoader)((long)&pFVar27->memory + 1);
          if (limit < pFVar28) goto LAB_00148cf1;
          uVar19 = (uint)*(byte *)&pFVar27->memory;
        }
        else {
          pFVar28 = (FT_GlyphLoader)((long)&pFVar27->memory + 2);
          if (limit < pFVar28) goto LAB_00148cf1;
          uVar19 = (uint)(ushort)(*(ushort *)&pFVar27->memory << 8 |
                                 *(ushort *)&pFVar27->memory >> 8);
        }
        *(uint *)((long)&pPVar12[uVar30].gps_size + lVar11) = uVar19;
        if ((char)bVar5 < '\0') {
          pFVar25 = (FT_GlyphLoader)((long)&pFVar28->memory + 3);
          if (limit < pFVar25) goto LAB_00148cf1;
          uVar19 = (uint)*(byte *)((long)&pFVar28->memory + 1) << 8 |
                   (uint)*(byte *)&pFVar28->memory << 0x10;
          lVar21 = 2;
        }
        else {
          pFVar25 = (FT_GlyphLoader)((long)&pFVar28->memory + 2);
          if (limit < pFVar25) goto LAB_00148cf1;
          uVar19 = (uint)*(byte *)&pFVar28->memory << 8;
          lVar21 = 1;
        }
        *(uint *)((long)&pPVar12[uVar30].gps_offset + lVar11) =
             *(byte *)((long)&pFVar28->memory + lVar21) | uVar19;
        glyph->num_subs = glyph->num_subs + 1;
      }
      goto LAB_00148ac5;
    }
  }
  iVar16 = 8;
LAB_00148ac5:
  FT_Stream_ExitFrame(stream);
  uVar30 = local_a0;
  if (iVar16 == 0) {
    local_98 = (FT_GlyphLoader)(ulong)(glyph->num_subs - (int)local_a0);
    uVar18 = 0;
    local_90 = stream;
    local_80 = glyph;
    while (iVar16 = 0, (FT_GlyphLoader)uVar18 != local_98) {
      iVar16 = (int)(pFVar24->base).outline.n_points;
      local_a0 = uVar18;
      FVar9 = pfr_glyph_load_rec(glyph,local_90,local_88,
                                 (ulong)glyph->subs[uVar30 + uVar18].gps_offset,
                                 (ulong)glyph->subs[uVar30 + uVar18].gps_size);
      if (FVar9 != 0) {
        return FVar9;
      }
      pPVar12 = glyph->subs;
      iVar14 = (pFVar24->base).outline.n_points - iVar16;
      lVar11 = pPVar12[uVar30 + uVar18].x_scale;
      if ((lVar11 == 0x10000) && (pPVar12[uVar30 + uVar18].y_scale == 0x10000)) {
        pFVar22 = (pFVar24->base).outline.points;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        for (lVar11 = 0; iVar14 << 4 != (int)lVar11; lVar11 = lVar11 + 0x10) {
          lVar21._0_4_ = pPVar12[uVar30 + uVar18].x_delta;
          lVar21._4_4_ = pPVar12[uVar30 + uVar18].y_delta;
          auVar32._8_4_ = lVar21._4_4_;
          auVar32._0_8_ = lVar21;
          auVar32._12_4_ = -(uint)(lVar21 < 0);
          plVar2 = (long *)((long)&pFVar22[iVar16].x + lVar11);
          lVar23 = plVar2[1];
          plVar3 = (long *)((long)&pFVar22[iVar16].x + lVar11);
          *plVar3 = *plVar2 + CONCAT44(-(uint)((int)(undefined4)lVar21 < 0),(undefined4)lVar21);
          plVar3[1] = lVar23 + auVar32._8_8_;
        }
      }
      else {
        pFVar22 = (pFVar24->base).outline.points;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        for (lVar21 = 0; iVar14 << 4 != (int)lVar21; lVar21 = lVar21 + 0x10) {
          lVar23 = (long)*(int *)((long)&pFVar22[iVar16].x + lVar21) * (long)(int)lVar11;
          *(long *)((long)&pFVar22[iVar16].x + lVar21) =
               (long)(int)((ulong)(lVar23 + 0x8000 + (lVar23 >> 0x3f)) >> 0x10) +
               (long)pPVar12[uVar30 + uVar18].x_delta;
          lVar23 = (long)(int)pPVar12[uVar30 + uVar18].y_scale *
                   (long)*(int *)((long)&pFVar22[iVar16].y + lVar21);
          *(long *)((long)&pFVar22[iVar16].y + lVar21) =
               (long)(int)((ulong)(lVar23 + 0x8000 + (lVar23 >> 0x3f)) >> 0x10) +
               (long)pPVar12[uVar30 + uVar18].y_delta;
        }
      }
      uVar18 = local_a0 + 1;
    }
  }
  return iVar16;
LAB_0014909d:
  local_a8 = pFVar24;
  if (bVar5 - 1 < 3) {
    FVar9 = pfr_glyph_line_to(glyph,&local_78);
  }
  else if (bVar5 - 4 < 2) {
    pFVar25 = glyph->loader;
    local_98 = limit;
    pfr_glyph_close_contour(glyph);
    glyph->path_begun = '\x01';
    if ((((int)(pFVar25->base).outline.n_points + (int)(pFVar25->current).outline.n_points + 1U <=
          pFVar25->max_points) &&
        ((int)(pFVar25->base).outline.n_contours + (int)(pFVar25->current).outline.n_contours + 1U
         <= pFVar25->max_contours)) ||
       (FVar9 = FT_GlyphLoader_CheckPoints(pFVar25,1,1), limit = local_98, FVar9 == 0)) {
      FVar9 = pfr_glyph_line_to(glyph,&local_78);
      limit = local_98;
    }
  }
  else {
    if (bVar5 == 0) {
      pfr_glyph_close_contour(glyph);
      FT_GlyphLoader_Add(glyph->loader);
      FVar9 = error;
      goto LAB_00148c81;
    }
    FVar9 = 8;
    if (glyph->path_begun != '\0') {
      pFVar25 = glyph->loader;
      sVar8 = (pFVar25->current).outline.n_points;
      if (pFVar25->max_points < (int)(pFVar25->base).outline.n_points + (int)sVar8 + 3U) {
        local_98 = pFVar25;
        FVar9 = FT_GlyphLoader_CheckPoints(pFVar25,3,0);
        if (FVar9 != 0) goto LAB_001491ed;
        sVar8 = (local_98->current).outline.n_points;
        pFVar25 = local_98;
      }
      lVar11 = (long)sVar8;
      pFVar22 = (pFVar25->current).outline.points;
      pcVar7 = (pFVar25->current).outline.tags;
      pFVar22[lVar11].x = local_78.x;
      pFVar22[lVar11].y = local_78.y;
      pFVar22[lVar11 + 1].x = local_68;
      pFVar22[lVar11 + 1].y = FStack_60;
      pFVar22[lVar11 + 2].x = local_58;
      pFVar22[lVar11 + 2].y = FStack_50;
      pcVar4 = pcVar7 + lVar11;
      pcVar4[0] = '\x02';
      pcVar4[1] = '\x02';
      pcVar7[lVar11 + 2] = '\x01';
      psVar1 = &(pFVar25->current).outline.n_points;
      *psVar1 = *psVar1 + 3;
      FVar9 = 0;
    }
  }
LAB_001491ed:
  error = FVar9;
  FVar9 = error;
  if (error != 0) goto LAB_00148c81;
  goto LAB_00148e4c;
}

Assistant:

static FT_Error
  pfr_glyph_load_rec( PFR_Glyph  glyph,
                      FT_Stream  stream,
                      FT_ULong   gps_offset,
                      FT_ULong   offset,
                      FT_ULong   size )
  {
    FT_Error  error;
    FT_Byte*  p;
    FT_Byte*  limit;


    if ( FT_STREAM_SEEK( gps_offset + offset ) ||
         FT_FRAME_ENTER( size )                )
      goto Exit;

    p     = (FT_Byte*)stream->cursor;
    limit = p + size;

    if ( size > 0 && *p & PFR_GLYPH_IS_COMPOUND )
    {
      FT_UInt         n, old_count, count;
      FT_GlyphLoader  loader = glyph->loader;
      FT_Outline*     base   = &loader->base.outline;


      old_count = glyph->num_subs;

      /* this is a compound glyph - load it */
      error = pfr_glyph_load_compound( glyph, p, limit );

      FT_FRAME_EXIT();

      if ( error )
        goto Exit;

      count = glyph->num_subs - old_count;

      FT_TRACE4(( "compound glyph with %d element%s (offset %lu):\n",
                  count,
                  count == 1 ? "" : "s",
                  offset ));

      /* now, load each individual glyph */
      for ( n = 0; n < count; n++ )
      {
        FT_Int        i, old_points, num_points;
        PFR_SubGlyph  subglyph;


        FT_TRACE4(( "  subglyph %d:\n", n ));

        subglyph   = glyph->subs + old_count + n;
        old_points = base->n_points;

        error = pfr_glyph_load_rec( glyph, stream, gps_offset,
                                    subglyph->gps_offset,
                                    subglyph->gps_size );
        if ( error )
          break;

        /* note that `glyph->subs' might have been re-allocated */
        subglyph   = glyph->subs + old_count + n;
        num_points = base->n_points - old_points;

        /* translate and eventually scale the new glyph points */
        if ( subglyph->x_scale != 0x10000L || subglyph->y_scale != 0x10000L )
        {
          FT_Vector*  vec = base->points + old_points;


          for ( i = 0; i < num_points; i++, vec++ )
          {
            vec->x = FT_MulFix( vec->x, subglyph->x_scale ) +
                       subglyph->x_delta;
            vec->y = FT_MulFix( vec->y, subglyph->y_scale ) +
                       subglyph->y_delta;
          }
        }
        else
        {
          FT_Vector*  vec = loader->base.outline.points + old_points;


          for ( i = 0; i < num_points; i++, vec++ )
          {
            vec->x += subglyph->x_delta;
            vec->y += subglyph->y_delta;
          }
        }

        /* proceed to next sub-glyph */
      }

      FT_TRACE4(( "end compound glyph with %d element%s\n",
                  count,
                  count == 1 ? "" : "s" ));
    }
    else
    {
      FT_TRACE4(( "simple glyph (offset %lu)\n", offset ));

      /* load a simple glyph */
      error = pfr_glyph_load_simple( glyph, p, limit );

      FT_FRAME_EXIT();
    }

  Exit:
    return error;
  }